

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall google::protobuf::compiler::Parser::ParseLabel(Parser *this,Label *label)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  Label LVar3;
  long *local_38 [2];
  long local_28 [2];
  
  bVar2 = TryConsume(this,"optional");
  LVar3 = FieldDescriptorProto_Label_LABEL_OPTIONAL;
  if (!bVar2) {
    bVar2 = TryConsume(this,"repeated");
    LVar3 = FieldDescriptorProto_Label_LABEL_REPEATED;
    if (!bVar2) {
      bVar2 = TryConsume(this,"required");
      LVar3 = FieldDescriptorProto_Label_LABEL_REQUIRED;
      if (!bVar2) {
        local_38[0] = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_38,"Expected \"required\", \"optional\", or \"repeated\".","");
        pEVar1 = this->error_collector_;
        if (pEVar1 != (ErrorCollector *)0x0) {
          (*pEVar1->_vptr_ErrorCollector[2])
                    (pEVar1,(ulong)(uint)(this->input_->current_).line,
                     (ulong)(uint)(this->input_->current_).column,local_38);
        }
        this->had_errors_ = true;
        if (local_38[0] != local_28) {
          operator_delete(local_38[0],local_28[0] + 1);
        }
        LVar3 = FieldDescriptorProto_Label_LABEL_OPTIONAL;
      }
    }
  }
  *label = LVar3;
  return true;
}

Assistant:

bool Parser::ParseLabel(FieldDescriptorProto::Label* label) {
  if (TryConsume("optional")) {
    *label = FieldDescriptorProto::LABEL_OPTIONAL;
    return true;
  } else if (TryConsume("repeated")) {
    *label = FieldDescriptorProto::LABEL_REPEATED;
    return true;
  } else if (TryConsume("required")) {
    *label = FieldDescriptorProto::LABEL_REQUIRED;
    return true;
  } else {
    AddError("Expected \"required\", \"optional\", or \"repeated\".");
    // We can actually reasonably recover here by just assuming the user
    // forgot the label altogether.
    *label = FieldDescriptorProto::LABEL_OPTIONAL;
    return true;
  }
}